

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate-names.cc
# Opt level: O1

void __thiscall
wabt::anon_unknown_17::NameGenerator::GenerateAndBindName
          (NameGenerator *this,BindingHash *bindings,char *prefix,Index index,string *str)

{
  iterator iVar1;
  uint disambiguator;
  uint disambiguator_00;
  
  disambiguator_00 = 0;
  do {
    GenerateName(this,prefix,index,disambiguator_00,str);
    iVar1 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
            ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
                    *)bindings,str);
    disambiguator_00 = disambiguator_00 + 1;
  } while (iVar1.
           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>,_true>
           ._M_cur != (__node_type *)0x0);
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
  ::_M_emplace<std::__cxx11::string&,wabt::Binding>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
              *)bindings,0,str);
  return;
}

Assistant:

void NameGenerator::GenerateAndBindName(BindingHash* bindings,
                                        const char* prefix,
                                        Index index,
                                        std::string* str) {
  unsigned disambiguator = 0;
  while (true) {
    GenerateName(prefix, index, disambiguator, str);
    if (bindings->find(*str) == bindings->end()) {
      bindings->emplace(*str, Binding(index));
      break;
    }

    disambiguator++;
  }
}